

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O3

void __thiscall Mems::find_samples_next_to_mirror_fast(Mems *this,Portioner *buckets)

{
  pointer *ppPVar1;
  Point_d *pPVar2;
  int iVar3;
  iterator __position;
  pointer pMVar4;
  pointer pMVar5;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __first;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __last;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  Point_d *pPVar9;
  undefined4 uVar10;
  Point_d *pPVar11;
  pointer pPVar12;
  ostream *poVar13;
  ulong uVar14;
  pointer pvVar15;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> _Var16;
  pointer pPVar17;
  uint uVar18;
  Point_d *pPVar19;
  undefined1 auVar20 [8];
  long lVar21;
  pointer pMVar22;
  size_t __n;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __i;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auStack_58 [8];
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  point_cluster;
  
  pMVar22 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar22 !=
      (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      Portioner::get_bucket_cluster
                ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                  *)auStack_58,buckets,&pMVar22->_position);
      pPVar12 = (pMVar22->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar17 = (pMVar22->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar18 = 5;
      do {
        if (pPVar17 != pPVar12) {
          (pMVar22->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl
          .super__Vector_impl_data._M_finish = pPVar12;
        }
        pMVar22->_ammount_of_matching_samples = 0;
        pvVar15 = (pointer)CONCAT44(point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
        pPVar17 = pPVar12;
        if (auStack_58 != (undefined1  [8])pvVar15) {
          auVar20 = auStack_58;
          do {
            pPVar19 = (((pointer)auVar20)->super__Vector_base<Point_d,_std::allocator<Point_d>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pPVar11 = (((pointer)auVar20)->super__Vector_base<Point_d,_std::allocator<Point_d>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            if (pPVar19 != pPVar11) {
              do {
                dVar24 = (pMVar22->_position).x - pPVar19->x;
                dVar6 = (pMVar22->_position).y - pPVar19->y;
                dVar6 = dVar6 * dVar6 + dVar24 * dVar24;
                if (dVar6 <= (double)(int)(uVar18 * uVar18 * 2)) {
                  pPVar19->dis = dVar6;
                  __position._M_current =
                       (pMVar22->_matching_samples).
                       super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pMVar22->_matching_samples).
                      super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<Point_d,std::allocator<Point_d>>::_M_realloc_insert<Point_d_const&>
                              ((vector<Point_d,std::allocator<Point_d>> *)
                               &pMVar22->_matching_samples,__position,pPVar19);
                  }
                  else {
                    dVar6 = pPVar19->x;
                    dVar24 = pPVar19->y;
                    iVar3 = pPVar19->id;
                    uVar10 = *(undefined4 *)&pPVar19->field_0x1c;
                    (__position._M_current)->dis = pPVar19->dis;
                    (__position._M_current)->id = iVar3;
                    *(undefined4 *)&(__position._M_current)->field_0x1c = uVar10;
                    (__position._M_current)->x = dVar6;
                    (__position._M_current)->y = dVar24;
                    ppPVar1 = &(pMVar22->_matching_samples).
                               super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                    *ppPVar1 = *ppPVar1 + 1;
                  }
                  pMVar22->_ammount_of_matching_samples = pMVar22->_ammount_of_matching_samples + 1;
                  pPVar11 = (((pointer)auVar20)->
                            super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                pPVar19 = pPVar19 + 1;
              } while (pPVar19 != pPVar11);
              pvVar15 = (pointer)CONCAT44(point_cluster.
                                          super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          point_cluster.
                                          super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_4_);
            }
            auVar20 = (undefined1  [8])((long)auVar20 + 0x18);
          } while (auVar20 != (undefined1  [8])pvVar15);
          pPVar12 = (pMVar22->_matching_samples).
                    super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pPVar17 = (pMVar22->_matching_samples).
                    super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      } while (((ulong)((long)pPVar17 - (long)pPVar12) < 0x81) &&
              (bVar23 = uVar18 < 0x12, uVar18 = uVar18 + 2, bVar23));
      iVar3 = pMVar22->id;
      if ((iVar3 * 0x3afb7e91 + 0x346dc0U >> 4 | iVar3 * 0x10000000) < 0x68db9) {
        pMVar4 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar5 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Find samples for all Mems-Mirrors  ",0x23);
        lVar21 = ((long)pMVar5 - (long)pMVar4 >> 3) * -0xf0f0f0f0f0f0f0f;
        auVar25._8_4_ = (int)((ulong)lVar21 >> 0x20);
        auVar25._0_8_ = lVar21;
        auVar25._12_4_ = 0x45300000;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,
                             (int)(((double)iVar3 /
                                   ((auVar25._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar21) - 4503599627370496.0)))
                                  * 100.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," % . \n",6);
      }
      std::
      vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
      ::~vector((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                 *)auStack_58);
      pMVar22 = pMVar22 + 1;
    } while (pMVar22 !=
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All samples for Mirrors found",0x1d);
  auStack_58[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,auStack_58,1);
  pMVar22 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar22 !=
      (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      __first._M_current =
           (pMVar22->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
           _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (pMVar22->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        uVar14 = (long)__last._M_current - (long)__first._M_current >> 5;
        lVar21 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar21 == 0; lVar21 = lVar21 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                  (__first,__last,(ulong)(((uint)lVar21 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10b37d);
        _Var16._M_current = __first._M_current;
        if ((long)__last._M_current - (long)__first._M_current < 0x201) {
          while (pPVar19 = _Var16._M_current + 1, pPVar19 != __last._M_current) {
            dVar6 = pPVar19->dis;
            if ((__first._M_current)->dis <= dVar6) {
              auStack_58 = (undefined1  [8])pPVar19->x;
              dVar7 = pPVar19->y;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar7,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
              iVar3 = pPVar19->id;
              dVar24 = (_Var16._M_current)->dis;
              pPVar11 = pPVar19;
              while (dVar6 < dVar24) {
                uVar8 = *(undefined8 *)((long)&pPVar11[-1].dis + 4);
                *(undefined8 *)((long)&pPVar11->y + 4) = *(undefined8 *)((long)&pPVar11[-1].y + 4);
                *(undefined8 *)((long)&pPVar11->dis + 4) = uVar8;
                dVar24 = pPVar11[-1].y;
                pPVar11->x = pPVar11[-1].x;
                pPVar11->y = dVar24;
                dVar24 = pPVar11[-2].dis;
                pPVar11 = pPVar11 + -1;
              }
              pPVar11->x = (double)auStack_58;
              pPVar11->y = dVar7;
              pPVar11->dis = dVar6;
              pPVar11->id = iVar3;
              _Var16._M_current = pPVar19;
            }
            else {
              auStack_58 = (undefined1  [8])pPVar19->x;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pPVar19->dis,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)((ulong)pPVar19->dis >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (undefined4)*(undefined8 *)&pPVar19->id;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)&pPVar19->id >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pPVar19->y,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)((ulong)pPVar19->y >> 0x20);
              memmove((void *)((long)_Var16._M_current +
                              (0x40 - ((long)pPVar19 - (long)__first._M_current))),
                      __first._M_current,(long)pPVar19 - (long)__first._M_current);
              (__first._M_current)->x = (double)auStack_58;
              (__first._M_current)->y =
                   (double)CONCAT44(point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
              *(ulong *)((long)&(__first._M_current)->y + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_);
              *(ulong *)((long)&(__first._M_current)->dis + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_);
              _Var16._M_current = pPVar19;
            }
          }
        }
        else {
          __n = 0x20;
          pPVar19 = __first._M_current + 1;
          do {
            pPVar11 = (Point_d *)((long)&(__first._M_current)->x + __n);
            dVar6 = *(double *)((long)&(__first._M_current)->dis + __n);
            if ((__first._M_current)->dis <= dVar6) {
              auStack_58 = (undefined1  [8])pPVar11->x;
              dVar7 = pPVar11->y;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar7,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
              iVar3 = pPVar11->id;
              dVar24 = (_Var16._M_current)->dis;
              pPVar2 = pPVar11;
              pPVar9 = pPVar19;
              while (dVar6 < dVar24) {
                pPVar2 = pPVar9 + -1;
                uVar8 = *(undefined8 *)((long)&pPVar9[-1].dis + 4);
                *(undefined8 *)((long)&pPVar9->y + 4) = *(undefined8 *)((long)&pPVar9[-1].y + 4);
                *(undefined8 *)((long)&pPVar9->dis + 4) = uVar8;
                dVar24 = pPVar9[-1].y;
                pPVar9->x = pPVar9[-1].x;
                pPVar9->y = dVar24;
                dVar24 = pPVar9[-2].dis;
                pPVar9 = pPVar2;
              }
              pPVar2->x = (double)auStack_58;
              pPVar2->y = dVar7;
              pPVar2->dis = dVar6;
              pPVar2->id = iVar3;
            }
            else {
              auStack_58 = (undefined1  [8])pPVar11->x;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pPVar11->dis,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)((ulong)pPVar11->dis >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (undefined4)*(undefined8 *)&pPVar11->id;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)&pPVar11->id >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pPVar11->y,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)((ulong)pPVar11->y >> 0x20);
              memmove(__first._M_current + 1,__first._M_current,__n);
              (__first._M_current)->x = (double)auStack_58;
              (__first._M_current)->y =
                   (double)CONCAT44(point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
              *(ulong *)((long)&(__first._M_current)->y + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_);
              *(ulong *)((long)&(__first._M_current)->dis + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_);
            }
            __n = __n + 0x20;
            pPVar19 = pPVar19 + 1;
            _Var16._M_current = pPVar11;
          } while (__n != 0x200);
          for (pPVar19 = __first._M_current + 0x10; pPVar19 != __last._M_current;
              pPVar19 = pPVar19 + 1) {
            auStack_58 = (undefined1  [8])pPVar19->x;
            dVar7 = pPVar19->y;
            point_cluster.
            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar7,0);
            point_cluster.
            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
            dVar6 = pPVar19->dis;
            iVar3 = pPVar19->id;
            dVar24 = pPVar19[-1].dis;
            pPVar11 = pPVar19;
            while (dVar6 < dVar24) {
              uVar8 = *(undefined8 *)((long)&pPVar11[-1].dis + 4);
              *(undefined8 *)((long)&pPVar11->y + 4) = *(undefined8 *)((long)&pPVar11[-1].y + 4);
              *(undefined8 *)((long)&pPVar11->dis + 4) = uVar8;
              dVar24 = pPVar11[-1].y;
              pPVar11->x = pPVar11[-1].x;
              pPVar11->y = dVar24;
              dVar24 = pPVar11[-2].dis;
              pPVar11 = pPVar11 + -1;
            }
            pPVar11->x = (double)auStack_58;
            pPVar11->y = dVar7;
            pPVar11->dis = dVar6;
            pPVar11->id = iVar3;
          }
        }
      }
      pMVar22 = pMVar22 + 1;
    } while (pMVar22 !=
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Mems::find_samples_next_to_mirror_fast(Portioner buckets){
        int       minfittingsamples = 999999;           //DeBUG
        int       x_y_distance;
  const int       x_y_distance_max = 20;                //maximum Distance between Mirror and Sample for x and y
        int       not_matching_mirror_ammount = 0;      //DebUG needed?

        bool      enough_samples;                       // needed?
        int       mirrornumber = 0;                     //ID

  const int       max_samples = 5;                      //max Ammount of needed Samples
  const int       min_samples = 2;


  //iterate selected_mirror all buckets
  for(auto selected_mirror = std::begin(_mems_mirrors); selected_mirror!=std::end(_mems_mirrors); ++selected_mirror){
    mirrornumber += 1;
    x_y_distance = 5;
    enough_samples = false;
    //fill vec with all relevant samplepoints with samples from mirrorbucket and buckets arround
    std::vector<std::vector<Point_d>>point_cluster = buckets.get_bucket_cluster(selected_mirror->_position);
  //  std::cout<<"id: "<<selected_mirror->id<<"\n";
  //  std::cout<<"size: \n";
/*
    int point_amm_in_cluster = 0;
    for(auto it = std::begin(point_cluster); it != std::end(point_cluster); it++){
      point_amm_in_cluster = point_amm_in_cluster+it->size();
    }

    std::cout<<"looking for samples for mirror "<< mirrornumber<<" with "<<point_amm_in_cluster<<" Points in MirrorCluster"<<"\n";
*/
    while(x_y_distance<x_y_distance_max ){
      //  while(x_y_distance<x_y_distance_max || (selected_mirror->_matching_samples.size() < min_samples)){
          selected_mirror->_matching_samples.clear();
          selected_mirror->_ammount_of_matching_samples = 0;
          //      std::cout<<" x_y_distance = "<<x_y_distance<<"\n";
          for(auto cluster_part = std::begin(point_cluster); cluster_part!=std::end(point_cluster); ++cluster_part)
          {
            for(auto point_to_check = std::begin(*cluster_part); point_to_check != std::end(*cluster_part); ++point_to_check)
            {
              //perform this actions for all Samples which are in bucket for mirror


              //----> nicht nötig          //check, if ammount of needed samples is reached
              //----> nicht nötig          //not reached: suche mit der aktuellen sample_distance in den buckets nach reached samples
                                  //  wenn distance <= (maxdis^2)*2
                                  //  put distance to point struct
                                  //  push back point to selected mirror
                                  //  incremet ammountof matching samples im selected mirror
                                  //  if ammount of matching samples = max_sample
                                  // break, go to next mems_mirror

              double sample_dis = pow(selected_mirror->_position.x-point_to_check->x , 2)+pow(selected_mirror->_position.y-point_to_check->y , 2);
              if(sample_dis<=x_y_distance*x_y_distance*2)
              {
                point_to_check->dis = sample_dis;
                selected_mirror->_matching_samples.push_back(*point_to_check);
                selected_mirror->_ammount_of_matching_samples = selected_mirror->_ammount_of_matching_samples +1;
  //              std::cout<<selected_mirror->_matching_samples.size()<<" ";

                //std::cout << "break2 \n" ;
              //  break;

              }
          //  MAXSAMPLES:
            }
          }
            if(selected_mirror->_matching_samples.size() >= max_samples){
            //  goto MAXSAMPLES;
            //    std::cout << "break1 \n" ;
            break;
            }
            x_y_distance += 2;
          }

          if(selected_mirror->id % 10000 == 0)
          {
            int progress = (int)((double)selected_mirror->id/(double)_mems_mirrors.size()*100) ;
            std::cout <<"Find samples for all Mems-Mirrors  "<< progress <<" % . \n";
          }

          if(minfittingsamples > selected_mirror->_matching_samples.size())
          {
            minfittingsamples = selected_mirror->_matching_samples.size();
            //std::cout << "Minimal fitting samples sind jetzt " <<minfittingsamples<<"\n \n";
          }
          if(minfittingsamples == 0 && selected_mirror->_matching_samples.size()==0)
          {
            not_matching_mirror_ammount += 1;
          }
        }
      //      std::cout << "not matching mirrorammount =  " <<not_matching_mirror_ammount<<"\n";
      std::cout << "All samples for Mirrors found"<< '\n';

      for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
      {
        std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
      }

  }